

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O2

QCalendarWidget * __thiscall QDateTimeEdit::calendarWidget(QDateTimeEdit *this)

{
  QDateTimeEditPrivate *this_00;
  QCalendarWidget *pQVar1;
  QCalendarPopup *this_01;
  
  this_00 = *(QDateTimeEditPrivate **)&(this->super_QAbstractSpinBox).super_QWidget.field_0x8;
  if ((this_00->calendarPopup == true) &&
     (((this_00->sections).super_QFlagsStorageHelper<QDateTimeEdit::Section,_4>.
       super_QFlagsStorage<QDateTimeEdit::Section>.i & 0x3f00) != 0)) {
    this_01 = this_00->monthCalendar;
    if (this_01 == (QCalendarPopup *)0x0) {
      QDateTimeEditPrivate::initCalendarPopup(this_00,(QCalendarWidget *)0x0);
      this_01 = this_00->monthCalendar;
    }
    pQVar1 = QCalendarPopup::verifyCalendarInstance(this_01);
    return pQVar1;
  }
  return (QCalendarWidget *)0x0;
}

Assistant:

T *get() const noexcept
    {
        return d;
    }